

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::add_a_d8(CPU *this)

{
  ushort uVar1;
  Registers *r1;
  IMmu *pIVar2;
  int iVar3;
  CPU *this_local;
  
  r1 = this->regs;
  pIVar2 = this->mmu;
  uVar1 = this->regs->pc;
  this->regs->pc = uVar1 + 1;
  iVar3 = (**pIVar2->_vptr_IMmu)(pIVar2,(ulong)uVar1);
  add_r8_r8(this,&r1->a,(uint8_t)iVar3);
  return 2;
}

Assistant:

int CPU::add_a_d8() {
    add_r8_r8(regs.a, mmu.read_byte(regs.pc++));
    return 2;
}